

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelInstance.cpp
# Opt level: O1

void __thiscall ModelInstance::ModelInstance(ModelInstance *this)

{
  long lVar1;
  NetworkArray *pNVar2;
  undefined8 *puVar3;
  byte bVar4;
  NetworkArray myNet;
  undefined8 auStack_2a18 [668];
  float local_1538;
  undefined4 local_1530;
  undefined4 uStack_152c;
  undefined4 uStack_1528;
  undefined4 uStack_1524;
  undefined4 local_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined4 local_1508;
  NetworkArray local_1500;
  
  bVar4 = 0;
  NetworkArray::NetworkArray(&this->network);
  (this->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  NetworkArray::NetworkArray(&local_1500);
  local_1518 = 0x33d6bf9533d6bf95;
  uStack_1510 = 0x233d6bf95;
  local_1508 = 1;
  pNVar2 = &local_1500;
  puVar3 = auStack_2a18;
  for (lVar1 = 0x29c; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)(pNVar2->transitions)._M_elems[0]._M_elems;
    pNVar2 = (NetworkArray *)((long)pNVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_1538 = local_1500.dt_react;
  local_1520 = 1;
  local_1530 = 0x33d6bf95;
  uStack_152c = 0x33d6bf95;
  uStack_1528 = 0x33d6bf95;
  uStack_1524 = 2;
  assign(this);
  return;
}

Assistant:

ModelInstance::ModelInstance() {
	NetworkArray myNet;
	ParameterObj myPars;
	assign(myNet, myPars);
}